

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSLModels.cpp
# Opt level: O0

void XPMP2::CSLModelsAdd(CSLModel *_csl)

{
  int iVar1;
  bool bVar2;
  pointer ppVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  reference this;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XPMP2::CSLModel>_>,_bool>
  pVar6;
  CSLObj *obj;
  iterator __end2;
  iterator __begin2;
  listCSLObjTy *__range2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XPMP2::CSLModel>_>,_bool>
  p;
  string cslKey;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  CSLModel *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XPMP2::CSLModel,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XPMP2::CSLModel>_>_>
  *in_stack_ffffffffffffff30;
  string *path;
  _Self local_90;
  _Self local_88;
  listCSLObjTy *local_80;
  string local_78 [32];
  _Base_ptr local_58;
  undefined1 local_50;
  _Base_ptr local_38;
  undefined1 local_30;
  string local_28 [8];
  
  CSLModel::GetKeyString_abi_cxx11_
            ((CSLModel *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  pVar6 = std::
          map<std::__cxx11::string,XPMP2::CSLModel,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,XPMP2::CSLModel>>>
          ::emplace<std::__cxx11::string_const&,XPMP2::CSLModel>
                    (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  local_58 = (_Base_ptr)pVar6.first._M_node;
  local_50 = pVar6.second;
  local_38 = local_58;
  local_30 = local_50;
  if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (glob < 3) {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XPMP2::CSLModel>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XPMP2::CSLModel>_>
                             *)0x33a999);
      CSLModel::GetModelName_abi_cxx11_(&ppVar3->second);
      uVar4 = std::__cxx11::string::c_str();
      path = (string *)&local_38;
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XPMP2::CSLModel>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XPMP2::CSLModel>_>
                             *)0x33a9cd);
      iVar1 = (ppVar3->second).xsbAircraftLn;
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XPMP2::CSLModel>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XPMP2::CSLModel>_>
                    *)0x33a9e1);
      StripXPSysDir(path);
      uVar5 = std::__cxx11::string::c_str();
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/CSLModels.cpp"
             ,0x26d,"CSLModelsAdd",logWARN,
             "Duplicate model \'%s\', additional definitions ignored, originally defined in line %d of %s"
             ,uVar4,iVar1,uVar5);
      std::__cxx11::string::~string(local_78);
    }
  }
  else {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XPMP2::CSLModel>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XPMP2::CSLModel>_>
                           *)0x33aa98);
    local_80 = &(ppVar3->second).listObj;
    local_88._M_node =
         (_List_node_base *)
         std::__cxx11::list<XPMP2::CSLObj,_std::allocator<XPMP2::CSLObj>_>::begin
                   ((list<XPMP2::CSLObj,_std::allocator<XPMP2::CSLObj>_> *)
                    CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    local_90._M_node =
         (_List_node_base *)
         std::__cxx11::list<XPMP2::CSLObj,_std::allocator<XPMP2::CSLObj>_>::end
                   ((list<XPMP2::CSLObj,_std::allocator<XPMP2::CSLObj>_> *)
                    CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    while (bVar2 = std::operator!=(&local_88,&local_90), bVar2) {
      this = std::_List_iterator<XPMP2::CSLObj>::operator*
                       ((_List_iterator<XPMP2::CSLObj> *)0x33aae4);
      std::__cxx11::string::operator=((string *)this,local_28);
      std::_List_iterator<XPMP2::CSLObj>::operator++(&local_88);
    }
  }
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void CSLModelsAdd (CSLModel& _csl)
{
    // the main map, which actually "owns" the object, indexed by key
    const std::string cslKey = _csl.GetKeyString();
    auto p = glob.mapCSLModels.emplace(cslKey, std::move(_csl));
    if (!p.second) {                    // not inserted, ie. not a new entry!
        LOG_MSG(logWARN, WARN_DUP_MODEL, p.first->second.GetModelName().c_str(),
                p.first->second.xsbAircraftLn,
                StripXPSysDir(p.first->second.xsbAircraftPath).c_str());
    } else {
        // Need to update the cslKey that is stored in the CSL objects as only now we have the final value
        for (CSLObj& obj : p.first->second.listObj)
            obj.cslKey = cslKey;
    }
}